

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall Memory::LargeHeapBlock::CapturePageHeapFreeStack(LargeHeapBlock *this)

{
  PageHeapData *pPVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  StackBackTrace *pSVar5;
  undefined8 *in_FS_OFFSET;
  
  pPVar1 = this->pageHeapData;
  if ((pPVar1 != (PageHeapData *)0x0) && (pPVar1->pageHeapMode != PageHeapModeOff)) {
    if (pPVar1->pageHeapFreeStack != (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x993,"(this->pageHeapData->pageHeapFreeStack == nullptr)",
                         "this->pageHeapData->pageHeapFreeStack == nullptr");
      if (!bVar4) goto LAB_00249781;
      *puVar2 = 0;
    }
    if (this->pageHeapData->pageHeapAllocStack == (StackBackTrace *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                         ,0x994,"(this->pageHeapData->pageHeapAllocStack != nullptr)",
                         "this->pageHeapData->pageHeapAllocStack != nullptr");
      if (!bVar4) {
LAB_00249781:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
    pSVar5 = this->pageHeapData->pageHeapFreeStack;
    if (pSVar5 != (StackBackTrace *)0x0) {
      StackBackTrace::Capture(pSVar5,0);
      return;
    }
    pSVar5 = StackBackTrace::Capture<Memory::NoThrowHeapAllocator>
                       ((NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,0,0x20);
    this->pageHeapData->pageHeapFreeStack = pSVar5;
  }
  return;
}

Assistant:

void
LargeHeapBlock::CapturePageHeapFreeStack()
{
#ifdef STACK_BACK_TRACE
    if (this->InPageHeapMode()) // pageheap can be enabled only for some of the buckets
    {
        // These asserts are true because explicit free is disallowed in
        // page heap mode. If they weren't, we'd have to modify the asserts
        Assert(this->pageHeapData->pageHeapFreeStack == nullptr);
        Assert(this->pageHeapData->pageHeapAllocStack != nullptr);

        if (this->pageHeapData->pageHeapFreeStack != nullptr)
        {
            this->pageHeapData->pageHeapFreeStack->Capture(Recycler::s_numFramesToSkipForPageHeapFree);
        }
        else
        {
            this->pageHeapData->pageHeapFreeStack = StackBackTrace::Capture(&NoThrowHeapAllocator::Instance,
                Recycler::s_numFramesToSkipForPageHeapFree, Recycler::s_numFramesToCaptureForPageHeap);
        }
    }
#endif
}